

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

bool32 rw::Engine::start(void)

{
  bool32 bVar1;
  PluginList *this;
  uint i;
  long lVar2;
  
  if ((engine == (void *)0x0) || (state != 2)) {
    start();
    bVar1 = 0;
  }
  else {
    lVar2 = 0;
    (**(code **)((long)engine + 0x108))(0,0,0);
    PluginList::construct((PluginList *)&s_plglist,engine);
    this = (PluginList *)&Driver::s_plglist;
    do {
      PluginList::construct(this,*(void **)((long)engine + lVar2 * 8 + 0x20));
      lVar2 = lVar2 + 1;
      this = this + 1;
    } while (lVar2 != 0xd);
    (**(code **)((long)engine + 0x108))(4,0,0);
    Image::registerFileFormat("tga",readTGA,writeTGA);
    Image::registerFileFormat("bmp",readBMP,writeBMP);
    Image::registerFileFormat("png",readPNG,writePNG);
    state = 3;
    bVar1 = 1;
  }
  return bVar1;
}

Assistant:

bool32
Engine::start(void)
{
	if(engine == nil || Engine::state != Opened){
		RWERROR((ERR_ENGINESTART));
		return 0;
	}

	engine->device.system(DEVICEINIT, nil, 0);

	Engine::s_plglist.construct(engine);
	for(uint i = 0; i < NUM_PLATFORMS; i++)
		Driver::s_plglist[i].construct(rw::engine->driver[i]);

	engine->device.system(DEVICEFINALIZE, nil, 0);

	// Register some image formats. Or should we leave that to the user?
	Image::registerFileFormat("tga", readTGA, writeTGA);
	Image::registerFileFormat("bmp", readBMP, writeBMP);
	Image::registerFileFormat("png", readPNG, writePNG);

	Engine::state = Started;
	return 1;
}